

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall
chatra::RuntimeImp::initialize
          (RuntimeImp *this,uint initialThreadCount,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *savedState)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __node_base_ptr p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Thread *pTVar7;
  fd_set *in_RCX;
  fd_set *__readfds;
  __shared_count<(__gnu_cxx::_Lock_policy)2> src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  fd_set *__readfds_00;
  fd_set *__readfds_01;
  fd_set *__readfds_02;
  fd_set *__readfds_03;
  fd_set *in_R8;
  timeval *in_R9;
  shared_ptr<chatra::StringTable> sVar8;
  undefined1 local_1c0 [8];
  Reader r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined1 local_48 [32];
  
  this->multiThread = initialThreadCount != 0xffffffff;
  registerEmbeddedClasses(&this->classes);
  registerEmbeddedFunctions(&this->methods,&this->operators);
  Reader::Reader((Reader *)local_1c0,this);
  Reader::parse((Reader *)local_1c0,300,savedState);
  peVar1 = (element_type *)(local_48 + 0x10);
  local_48._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"sTable","");
  iVar6 = Reader::select((Reader *)local_1c0,(int)local_48,__readfds,in_RCX,in_R8,in_R9);
  sVar8 = StringTable::newInstance
                    ((StringTable *)&r.nodeMethodTableMap._M_h._M_single_bucket,
                     (Reader *)CONCAT44(extraout_var,iVar6));
  p_Var3 = r.nodeMethodTableMap._M_h._M_single_bucket;
  src = sVar8.super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  r.nodeMethodTableMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var2 = (this->primarySTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->primarySTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p_Var3;
  (this->primarySTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_50;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    src._M_pi = extraout_RDX;
  }
  if ((element_type *)local_48._0_8_ != peVar1) {
    operator_delete((void *)local_48._0_8_);
    src._M_pi = extraout_RDX_00;
  }
  StringTable::copy((StringTable *)local_48,
                    (EVP_PKEY_CTX *)
                    (this->primarySTable).
                    super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (EVP_PKEY_CTX *)src._M_pi);
  uVar5 = local_48._8_8_;
  uVar4 = local_48._0_8_;
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->distributedSTable).
           super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->distributedSTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar4;
  (this->distributedSTable).super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  launchStorage(this);
  local_48._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"entity","");
  iVar6 = Reader::select((Reader *)local_1c0,(int)local_48,__readfds_00,in_RCX,in_R8,in_R9);
  restoreEntityFrames(this,(Reader *)CONCAT44(extraout_var_00,iVar6));
  if ((element_type *)local_48._0_8_ != peVar1) {
    operator_delete((void *)local_48._0_8_);
  }
  local_48._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"map","");
  iVar6 = Reader::select((Reader *)local_1c0,(int)local_48,__readfds_01,in_RCX,in_R8,in_R9);
  restoreEntityMap(this,(Reader *)CONCAT44(extraout_var_01,iVar6));
  if ((element_type *)local_48._0_8_ != peVar1) {
    operator_delete((void *)local_48._0_8_);
  }
  local_48._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"storage","");
  iVar6 = Reader::select((Reader *)local_1c0,(int)local_48,__readfds_02,in_RCX,in_R8,in_R9);
  restoreStorage(this,(Reader *)CONCAT44(extraout_var_02,iVar6));
  if ((element_type *)local_48._0_8_ != peVar1) {
    operator_delete((void *)local_48._0_8_);
  }
  local_48._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"state","");
  iVar6 = Reader::select((Reader *)local_1c0,(int)local_48,__readfds_03,in_RCX,in_R8,in_R9);
  restoreState(this,(Reader *)CONCAT44(extraout_var_03,iVar6));
  if ((element_type *)local_48._0_8_ != peVar1) {
    operator_delete((void *)local_48._0_8_);
  }
  pTVar7 = IdPool<chatra::Requester,_chatra::Thread>::lockAndRef(&this->threadIds,1);
  this->finalizerThread = pTVar7;
  launchSystem(this,initialThreadCount);
  reactivateThreads(this);
  reactivateTimers(this);
  std::
  _Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::MethodTable_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::MethodTable_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::MethodTable_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::MethodTable_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&r.nodeMethodMap._M_h._M_single_bucket);
  std::
  _Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::Method_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Method_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::Method_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Method_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&r.nodeClassMap._M_h._M_single_bucket);
  std::
  _Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::Class_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Class_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::Class_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Class_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&r.rootMap._M_h._M_single_bucket);
  std::
  _Hashtable<long,_std::pair<const_long,_const_chatra::Node_*>,_std::allocator<std::pair<const_long,_const_chatra::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_const_chatra::Node_*>,_std::allocator<std::pair<const_long,_const_chatra::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&r.classMap.
                    super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (r._104_8_ != 0) {
    operator_delete((void *)r._104_8_);
  }
  if (r.chunks._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(r.chunks._M_h._M_single_bucket);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&r.offset);
  return;
}

Assistant:

void RuntimeImp::initialize(unsigned initialThreadCount, const std::vector<uint8_t>& savedState) {
	multiThread = (initialThreadCount != std::numeric_limits<unsigned>::max());

	registerEmbeddedClasses(classes);
	registerEmbeddedFunctions(methods, operators);

	Reader r(*this);
	r.parse(currentVersion, savedState);

	try {
		primarySTable = StringTable::newInstance(r.select("sTable"));
		distributedSTable = primarySTable->copy();

		// Restore the world
		launchStorage();

		restoreEntityFrames(r.select("entity"));
		restoreEntityMap(r.select("map"));
		restoreStorage(r.select("storage"));
		restoreState(r.select("state"));
	}
	catch (...) {
		throw IllegalArgumentException();
	}

	chatra_assert(storage->audit());
	chatra_assert(!primarySTable->isDirty());

	reactivateFinalizerThread();

	launchSystem(initialThreadCount);
	reactivateThreads();
	reactivateTimers();
}